

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303D::setGyroCTRL4(RTIMUGD20HM303D *this)

{
  int iVar1;
  bool bVar2;
  uchar local_19;
  uchar ctrl4;
  RTIMUGD20HM303D *this_local;
  
  iVar1 = ((this->super_RTIMU).m_settings)->m_GD20HM303DGyroFsr;
  if (iVar1 == 0) {
    local_19 = '\0';
    this->m_gyroScale = 0.00015271631;
  }
  else if (iVar1 == 1) {
    local_19 = '\x10';
    this->m_gyroScale = 0.00030543262;
  }
  else {
    if (iVar1 != 2) {
      fprintf(_stderr,"Illegal L3GD20H FSR code %d\n",
              (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DGyroFsr);
      return false;
    }
    local_19 = ' ';
    this->m_gyroScale = 0.0012217305;
  }
  bVar2 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_gyroSlaveAddr
                             ,'#',local_19,"Failed to set L3GD20H CTRL4");
  return bVar2;
}

Assistant:

bool RTIMUGD20HM303D::setGyroCTRL4()
{
    unsigned char ctrl4;

    switch (m_settings->m_GD20HM303DGyroFsr) {
    case L3GD20H_FSR_245:
        ctrl4 = 0x00;
        m_gyroScale = (RTFLOAT)0.00875 * RTMATH_DEGREE_TO_RAD;
        break;

    case L3GD20H_FSR_500:
        ctrl4 = 0x10;
        m_gyroScale = (RTFLOAT)0.0175 * RTMATH_DEGREE_TO_RAD;
        break;

    case L3GD20H_FSR_2000:
        ctrl4 = 0x20;
        m_gyroScale = (RTFLOAT)0.07 * RTMATH_DEGREE_TO_RAD;
        break;

    default:
        HAL_ERROR1("Illegal L3GD20H FSR code %d\n", m_settings->m_GD20HM303DGyroFsr);
        return false;
    }

    return m_settings->HALWrite(m_gyroSlaveAddr,  L3GD20H_CTRL4, ctrl4, "Failed to set L3GD20H CTRL4");
}